

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kern.cxx
# Opt level: O3

void HAXX::Kern<HAXX::quaternion<double>,HAXX::quaternion<double>,HAXX::quaternion<double>>
               (int32_t M,int32_t N,int32_t K,quaternion<double> *A,quaternion<double> *B,
               quaternion<double> *C,int32_t LDC)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool bVar7;
  uint uVar8;
  long lVar9;
  undefined1 auVar10 [32];
  quaternion<double> qVar12;
  undefined1 auVar13 [32];
  quaternion<double> qVar14;
  undefined1 auVar16 [32];
  undefined1 auVar17 [64];
  quaternion<double> qVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [64];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar11 [64];
  undefined1 auVar15 [64];
  
  if (M == 2) {
    qVar12 = C[1];
    if (N == 2) {
      qVar14 = C[LDC];
      qVar18 = C[(long)LDC + 1];
      bVar7 = false;
      goto LAB_002083da;
    }
  }
  else {
    bVar7 = true;
    qVar12 = (quaternion<double>)(SUB6432(ZEXT864(0),0) << 0x40);
    if (N == 2) {
      qVar18 = (quaternion<double>)ZEXT1632(ZEXT816(0));
      qVar14 = C[LDC];
      goto LAB_002083da;
    }
  }
  qVar14 = (quaternion<double>)ZEXT1632(ZEXT816(0));
  bVar7 = true;
  qVar18 = (quaternion<double>)ZEXT1632(ZEXT816(0));
LAB_002083da:
  auVar16 = vunpcklpd_avx((undefined1  [32])*C,(undefined1  [32])qVar14);
  auVar19 = vunpckhpd_avx((undefined1  [32])*C,(undefined1  [32])qVar14);
  auVar21 = vunpcklpd_avx((undefined1  [32])qVar12,(undefined1  [32])qVar18);
  auVar2 = vunpckhpd_avx((undefined1  [32])qVar12,(undefined1  [32])qVar18);
  auVar10._16_16_ = auVar21._0_16_;
  auVar10._0_16_ = auVar16._0_16_;
  auVar11 = ZEXT3264(auVar10);
  auVar13._16_16_ = auVar2._0_16_;
  auVar13._0_16_ = auVar19._0_16_;
  auVar15 = ZEXT3264(auVar13);
  auVar16 = vperm2f128_avx(auVar16,auVar21,0x31);
  auVar17 = ZEXT3264(auVar16);
  auVar19 = vperm2f128_avx(auVar19,auVar2,0x31);
  auVar20 = ZEXT3264(auVar19);
  if (0 < K) {
    uVar8 = K + 1;
    lVar9 = 0;
    do {
      auVar19 = *(undefined1 (*) [32])((long)&A->_M_real + lVar9);
      auVar1 = *(undefined1 (*) [16])((long)&B->_M_real + lVar9);
      auVar23._16_16_ = auVar1;
      auVar23._0_16_ = auVar1;
      auVar1 = *(undefined1 (*) [16])((long)&B[1]._M_real + lVar9);
      auVar24._16_16_ = auVar1;
      auVar24._0_16_ = auVar1;
      auVar1 = *(undefined1 (*) [16])((long)&B->_M_imag_j + lVar9);
      auVar25._16_16_ = auVar1;
      auVar25._0_16_ = auVar1;
      auVar1 = *(undefined1 (*) [16])((long)&B[1]._M_imag_j + lVar9);
      auVar26._16_16_ = auVar1;
      auVar26._0_16_ = auVar1;
      auVar2 = *(undefined1 (*) [32])((long)&A[1]._M_real + lVar9);
      uVar8 = uVar8 - 1;
      lVar9 = lVar9 + 0x40;
      auVar16 = vshufpd_avx(auVar19,auVar19,0xf);
      auVar21._8_8_ = auVar19._0_8_;
      auVar21._0_8_ = auVar19._0_8_;
      auVar21._16_8_ = auVar19._16_8_;
      auVar21._24_8_ = auVar19._16_8_;
      auVar19 = vshufpd_avx(auVar2,auVar2,0xf);
      auVar22._8_8_ = auVar2._0_8_;
      auVar22._0_8_ = auVar2._0_8_;
      auVar22._16_8_ = auVar2._16_8_;
      auVar22._24_8_ = auVar2._16_8_;
      auVar1 = vfmadd231pd_fma(auVar11._0_32_,auVar21,auVar23);
      auVar3 = vfmadd231pd_fma(auVar15._0_32_,auVar21,auVar24);
      auVar4 = vfmadd231pd_fma(auVar17._0_32_,auVar21,auVar25);
      auVar5 = vfmadd231pd_fma(auVar20._0_32_,auVar26,auVar21);
      auVar6 = vfnmadd231pd_fma(ZEXT1632(auVar1),auVar16,auVar24);
      auVar1 = vfmadd231pd_fma(ZEXT1632(auVar3),auVar16,auVar23);
      auVar4 = vfnmadd231pd_fma(ZEXT1632(auVar4),auVar16,auVar26);
      auVar3 = vfmadd231pd_fma(ZEXT1632(auVar5),auVar16,auVar25);
      auVar5 = vfnmadd231pd_fma(ZEXT1632(auVar6),auVar22,auVar25);
      auVar1 = vfmadd231pd_fma(ZEXT1632(auVar1),auVar22,auVar26);
      auVar4 = vfmadd231pd_fma(ZEXT1632(auVar4),auVar22,auVar23);
      auVar3 = vfnmadd231pd_fma(ZEXT1632(auVar3),auVar22,auVar24);
      auVar5 = vfnmadd231pd_fma(ZEXT1632(auVar5),auVar19,auVar26);
      auVar11 = ZEXT1664(auVar5);
      auVar10 = ZEXT1632(auVar5);
      auVar1 = vfnmadd231pd_fma(ZEXT1632(auVar1),auVar19,auVar25);
      auVar15 = ZEXT1664(auVar1);
      auVar13 = ZEXT1632(auVar1);
      auVar1 = vfmadd231pd_fma(ZEXT1632(auVar4),auVar19,auVar24);
      auVar17 = ZEXT1664(auVar1);
      auVar16 = ZEXT1632(auVar1);
      auVar1 = vfmadd231pd_fma(ZEXT1632(auVar3),auVar19,auVar23);
      auVar20 = ZEXT1664(auVar1);
      auVar19 = ZEXT1632(auVar1);
    } while (1 < uVar8);
  }
  auVar2 = vunpcklpd_avx(auVar10,auVar13);
  auVar21 = vunpcklpd_avx(auVar16,auVar19);
  qVar12._M_imag_j = (double)SUB168(auVar21._0_16_,0);
  qVar12._M_imag_k = (double)SUB168(auVar21._0_16_,8);
  qVar12._M_real = (double)SUB168(auVar2._0_16_,0);
  qVar12._M_imag_i = (double)SUB168(auVar2._0_16_,8);
  *C = qVar12;
  if (M == 2) {
    qVar12 = (quaternion<double>)vperm2f128_avx(auVar2,auVar21,0x31);
    C[1] = qVar12;
  }
  auVar19 = vunpckhpd_avx(auVar16,auVar19);
  auVar2 = vunpckhpd_avx(auVar10,auVar13);
  if (N == 2) {
    qVar14._M_imag_j = (double)SUB168(auVar19._0_16_,0);
    qVar14._M_imag_k = (double)SUB168(auVar19._0_16_,8);
    qVar14._M_real = (double)SUB168(auVar2._0_16_,0);
    qVar14._M_imag_i = (double)SUB168(auVar2._0_16_,8);
    C[LDC] = qVar14;
  }
  if (!bVar7) {
    qVar12 = (quaternion<double>)vperm2f128_avx(auVar2,auVar19,0x31);
    C[(long)LDC + 1] = qVar12;
  }
  return;
}

Assistant:

void Kern(HAXX_INT M, HAXX_INT N, HAXX_INT K, 
  quaternion<double>* __restrict__ A, quaternion<double>* __restrict__ B, 
  quaternion<double>* __restrict__ C, HAXX_INT LDC) {

  __m256d t1,t2,t3,t4;

  const bool M2 = (M == 2);
  const bool N2 = (N == 2);

  // Load C
  __m256d c00 = LOAD_256D_UNALIGNED_AS(double,C      );

  __m256d c10 = M2 ? LOAD_256D_UNALIGNED_AS(double,C+1    ) :
                           _mm256_setzero_pd();

  __m256d c01 = N2 ? LOAD_256D_UNALIGNED_AS(double,C+LDC  ) :
                           _mm256_setzero_pd();

  __m256d c11 = ( M2 and N2 ) ?  LOAD_256D_UNALIGNED_AS(double,C+LDC+1) :
                                 _mm256_setzero_pd();

  _MM_TRANSPOSE_4x4_PD(c00,c01,c10,c11,t1,t2,t3,t4);


  quaternion<double> *locB = B, *locA = A;

  HAXX_INT k = K;

  if( k > 0 )
  do {

    // Load A 
    __m256d a00 = LOAD_256D_ALIGNED_AS(double,locA);
    __m256d a10 = LOAD_256D_ALIGNED_AS(double,locA+1);
    locA += 2;
    

    // Load B

#ifndef _FACTOR_TRANSPOSE_INTO_B_PACK
    __m256d b00 = LOAD_256D_ALIGNED_AS(double,locB);
    __m256d b10 = LOAD_256D_ALIGNED_AS(double,locB+1);
#else
    double *BasDouble = reinterpret_cast<double*>(locB);
    __m128d b00lo = LOAD_128D_ALIGNED(BasDouble);
    __m128d b00hi = LOAD_128D_ALIGNED(BasDouble+2);
    __m128d b10lo = LOAD_128D_ALIGNED(BasDouble+4);
    __m128d b10hi = LOAD_128D_ALIGNED(BasDouble+6);
#endif
    locB += 2;


#ifdef _FACTOR_TRANSPOSE_INTO_A_PACK

    __m256d a_IIII = _mm256_permute_pd(a00,0xF);
    a00            = _mm256_permute_pd(a00,0x0); // SSSS
  
    __m256d a_KKKK = _mm256_permute_pd(a10,0xF);
    a10            = _mm256_permute_pd(a10,0x0); // SSSS

    __m256d &a00c = a_IIII;
    __m256d &a10c = a_KKKK;

#else

    __m256d a00c = a00;
    __m256d a10c = a10;
    _MM_TRANSPOSE_4x4_PD(a00,a00c,a10,a10c,t1,t2,t3,t4);

#endif

#ifdef _FACTOR_TRANSPOSE_INTO_B_PACK

    __m256d bSSSS = SET_256D_FROM_128D(b00lo,b00lo);
    __m256d bIIII = SET_256D_FROM_128D(b10lo,b10lo);
    __m256d bJJJJ = SET_256D_FROM_128D(b00hi,b00hi);
    __m256d bKKKK = SET_256D_FROM_128D(b10hi,b10hi);

    __m256d &b00  = bSSSS;
    __m256d &b10  = bIIII;
    __m256d &b00c = bJJJJ;
    __m256d &b10c = bKKKK;

#else

    __m256d b00c = b00;
    __m256d b10c = b10;
    _MM_TRANSPOSE_4x4_PD(b00,b10,b00c,b10c,t1,t2,t3,t4);

#endif

    INC_MULD4Q_NN(a00,a00c,a10,a10c,b00,b10,b00c,b10c,c00,c01,c10,c11);
  

    k--;
  } while( k > 0 );

  _MM_TRANSPOSE_4x4_PD(c00,c01,c10,c11,t1,t2,t3,t4);

  STORE_256D_UNALIGNED_AS(double,C      ,c00);
  if( M2 ) STORE_256D_UNALIGNED_AS(double,C+1    ,c10);
  if( N2 ) STORE_256D_UNALIGNED_AS(double,C+LDC  ,c01);
  if( M2 and N2 ) STORE_256D_UNALIGNED_AS(double,C+LDC+1,c11);
  

}